

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::lastVisibleItem(QTreeViewPrivate *this,int firstVisual,int offset)

{
  int iVar1;
  int iVar2;
  QWidgetData *pQVar3;
  int iVar4;
  int iVar5;
  int item;
  ulong uVar7;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  ulong uVar6;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = offset;
  if (((offset | firstVisual) < 0) &&
     (firstVisual = firstVisibleItem(this,&local_2c), firstVisual < 0)) {
    item = -1;
  }
  else {
    uVar7 = (ulong)(uint)firstVisual;
    uVar6 = (this->viewItems).d.size;
    if (uVar7 < uVar6) {
      pQVar3 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
               data;
      iVar1 = (pQVar3->crect).y2.m_i;
      iVar2 = (pQVar3->crect).y1.m_i;
      iVar4 = -local_2c;
      do {
        item = (int)uVar7;
        iVar5 = itemHeight(this,item);
        iVar4 = iVar5 + iVar4;
        if ((iVar1 - iVar2) + 1 < iVar4) goto LAB_005a7c46;
        uVar7 = uVar7 + 1;
        uVar6 = (this->viewItems).d.size;
      } while (uVar7 < uVar6);
    }
    item = (int)uVar6 + -1;
  }
LAB_005a7c46:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return item;
}

Assistant:

int QTreeViewPrivate::lastVisibleItem(int firstVisual, int offset) const
{
    if (firstVisual < 0 || offset < 0) {
        firstVisual = firstVisibleItem(&offset);
        if (firstVisual < 0)
            return -1;
    }
    int y = - offset;
    int value = viewport->height();

    for (int i = firstVisual; i < viewItems.size(); ++i) {
        y += itemHeight(i); // the height value is cached
        if (y > value)
            return i;
    }
    return viewItems.size() - 1;
}